

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeGeneratorFunction
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  GeneratorVirtualScriptFunction *pGVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  JavascriptGeneratorFunction *instance_00;
  Type *pTVar6;
  DynamicObject *pDVar7;
  undefined4 *puVar8;
  JavascriptString *local_38;
  JavascriptString *functionName;
  Var varLength;
  
  instance_00 = VarTo<Js::JavascriptGeneratorFunction,Js::DynamicObject>(instance);
  iVar4 = (*(instance_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x77])(instance_00);
  this = (((instance_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  pTVar6 = &this->functionWithPrototypeAndLengthTypeHandler;
  if ((char)iVar4 != '\0') {
    pTVar6 = &this->anonymousFunctionWithPrototypeTypeHandler;
  }
  DeferredTypeHandlerBase::ConvertFunction
            (typeHandler,(JavascriptFunction *)instance_00,pTVar6->ptr);
  pDVar7 = CreateGeneratorConstructorPrototypeObject(this);
  (*(instance_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(instance_00,0x124,pDVar7,4,0,0,0xf);
  pGVar1 = (instance_00->scriptFunction).ptr;
  iVar5 = (**(code **)((long)(pGVar1->super_ScriptFunction).super_ScriptFunctionBase.
                             super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x90))
                    (pGVar1,pGVar1,0xd1,&functionName,0,
                     (((((pGVar1->super_ScriptFunction).super_ScriptFunctionBase.
                         super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.type.
                        ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                     ptr);
  if (iVar5 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x347,"(false)",
                                "Initializing Generator function without a length property - why isn\'t there a length?."
                               );
    if (!bVar3) goto LAB_00a96488;
    *puVar8 = 0;
    functionName = (JavascriptString *)&DAT_1000000000000;
  }
  (*(instance_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(instance_00,0xd1,functionName,2,0,0,0);
  if ((char)iVar4 == '\0') {
    local_38 = (JavascriptString *)0x0;
    bVar3 = JavascriptFunction::GetFunctionName((JavascriptFunction *)instance_00,&local_38);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x350,"(status)","status");
      if (!bVar3) {
LAB_00a96488:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    (*(instance_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(instance_00,0x106,local_38,2,0,0,0xf);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptGeneratorFunction *function = VarTo<JavascriptGeneratorFunction>(instance);
        bool isAnonymousFunction = function->IsAnonymousFunction();

        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        typeHandler->ConvertFunction(function, isAnonymousFunction ? javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler : javascriptLibrary->functionWithPrototypeAndLengthTypeHandler);
        function->SetPropertyWithAttributes(PropertyIds::prototype, javascriptLibrary->CreateGeneratorConstructorPrototypeObject(), PropertyWritable, nullptr);

        Var varLength;
        GeneratorVirtualScriptFunction* scriptFunction = function->GetGeneratorVirtualScriptFunction();
        if (!scriptFunction->GetProperty(scriptFunction, PropertyIds::length, &varLength, nullptr, scriptFunction->GetScriptContext()))
        {
            // TODO - remove this if or convert it to a FailFast if this assert never triggers
            // Nothing in the ChakraCore CI will reach this code
            AssertMsg(false, "Initializing Generator function without a length property - why isn't there a length?.");
            varLength = TaggedInt::ToVarUnchecked(0);
        }
        function->SetPropertyWithAttributes(PropertyIds::length, varLength, PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);

        if (!isAnonymousFunction)
        {
            JavascriptString * functionName = nullptr;
            DebugOnly(bool status = ) ((Js::JavascriptFunction*)function)->GetFunctionName(&functionName);
            Assert(status);
            function->SetPropertyWithAttributes(PropertyIds::name,functionName, PropertyConfigurable, nullptr);
        }

        return true;
    }